

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Pubkey * __thiscall
cfd::core::Pubkey::CreateTweakMul(Pubkey *__return_storage_ptr__,Pubkey *this,ByteData256 *tweak)

{
  ByteData tweak_muled;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  WallyUtil::MulTweakPubkey((ByteData *)&local_28,&this->data_,tweak);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28);
  Pubkey(__return_storage_ptr__,(ByteData *)&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::CreateTweakMul(const ByteData256 &tweak) const {
  ByteData tweak_muled = WallyUtil::MulTweakPubkey(data_, tweak);
  return Pubkey(tweak_muled);
}